

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int h2o_file_send(h2o_req_t *req,int status,char *reason,char *path,h2o_iovec_t mime_type,int flags)

{
  int iVar1;
  size_t path_len;
  st_h2o_sendfile_generator_t *self;
  int is_dir;
  
  path_len = strlen(path);
  self = create_generator(req,path,path_len,&is_dir,flags);
  if (self == (st_h2o_sendfile_generator_t *)0x0) {
    iVar1 = -1;
  }
  else {
    do_send_file(self,req,status,reason,mime_type,(h2o_mime_attributes_t *)0x0,1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int h2o_file_send(h2o_req_t *req, int status, const char *reason, const char *path, h2o_iovec_t mime_type, int flags)
{
    struct st_h2o_sendfile_generator_t *self;
    int is_dir;

    if ((self = create_generator(req, path, strlen(path), &is_dir, flags)) == NULL)
        return -1;
    /* note: is_dir is not handled */
    do_send_file(self, req, status, reason, mime_type, NULL, 1);
    return 0;
}